

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void freeobj(lua_State *L,GCObject *o)

{
  long local_60;
  TString *ts_1;
  TString *ts;
  Udata *u;
  CClosure *cl_1;
  LClosure *cl;
  GCObject *o_local;
  lua_State *L_local;
  
  switch(o->tt) {
  case '\x04':
    luaS_remove(L,(TString *)o);
    luaM_free_(L,o,(long)(int)((byte)o->field_0xb + 1) + 0x18);
    break;
  case '\x05':
    luaH_free(L,(Table *)o);
    break;
  case '\x06':
    luaM_free_(L,o,(long)(int)((uint)(byte)o->field_0xa * 8 + 0x20));
    break;
  case '\a':
    if (*(short *)&o->field_0xa == 0) {
      local_60 = 0x20;
    }
    else {
      local_60 = (ulong)*(ushort *)&o->field_0xa * 0x10 + 0x28;
    }
    luaM_free_(L,o,(long)&(o[1].next)->next + local_60);
    break;
  case '\b':
    luaE_freethread(L,(lua_State *)o);
    break;
  case '\t':
    freeupval(L,(UpVal *)o);
    break;
  case '\n':
    luaF_freeproto(L,(Proto *)o);
    break;
  default:
    break;
  case '\x14':
    luaM_free_(L,o,(size_t)&o[1].next[1].marked);
    break;
  case '&':
    luaM_free_(L,o,(long)(int)((uint)(byte)o->field_0xa * 0x10 + 0x20));
  }
  return;
}

Assistant:

static void freeobj (lua_State *L, GCObject *o) {
  switch (o->tt) {
    case LUA_VPROTO:
      luaF_freeproto(L, gco2p(o));
      break;
    case LUA_VUPVAL:
      freeupval(L, gco2upv(o));
      break;
    case LUA_VLCL: {
      LClosure *cl = gco2lcl(o);
      luaM_freemem(L, cl, sizeLclosure(cl->nupvalues));
      break;
    }
    case LUA_VCCL: {
      CClosure *cl = gco2ccl(o);
      luaM_freemem(L, cl, sizeCclosure(cl->nupvalues));
      break;
    }
    case LUA_VTABLE:
      luaH_free(L, gco2t(o));
      break;
    case LUA_VTHREAD:
      luaE_freethread(L, gco2th(o));
      break;
    case LUA_VUSERDATA: {
      Udata *u = gco2u(o);
      luaM_freemem(L, o, sizeudata(u->nuvalue, u->len));
      break;
    }
    case LUA_VSHRSTR: {
      TString *ts = gco2ts(o);
      luaS_remove(L, ts);  /* remove it from hash table */
      luaM_freemem(L, ts, sizelstring(ts->shrlen));
      break;
    }
    case LUA_VLNGSTR: {
      TString *ts = gco2ts(o);
      luaM_freemem(L, ts, sizelstring(ts->u.lnglen));
      break;
    }
    default: lua_assert(0);
  }
}